

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::UnaryOP(SQCompiler *this,SQOpcode op)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  SQInstruction local_20;
  
  PrefixedExpr(this);
  SVar1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  SVar2 = SQFuncState::PushTarget(this_00,-1);
  local_20._arg0 = (uchar)SVar2;
  local_20._arg1 = (SQInt32)SVar1;
  local_20._arg2 = '\0';
  local_20._arg3 = '\0';
  local_20.op = (uchar)op;
  SQFuncState::AddInstruction(this_00,&local_20);
  return;
}

Assistant:

void UnaryOP(SQOpcode op)
    {
        PrefixedExpr();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), src);
    }